

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O2

void __thiscall
symbol_table_visitor::visit(symbol_table_visitor *this,NotExtendedClassDeclaration *ptr)

{
  BaseScope *pBVar1;
  pointer ppDVar2;
  ClassSymbol *this_00;
  mapped_type *ppBVar3;
  BaseScope *this_01;
  pointer ppDVar4;
  
  assert_not_declared_in_this_scope(this,(ptr->super_Class_declaration).name);
  pBVar1 = this->curr_scope;
  this_00 = (ClassSymbol *)operator_new(0x58);
  ClassSymbol::ClassSymbol(this_00,&ptr->super_Class_declaration);
  this->curr_class = this_00;
  ppBVar3 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pBVar1->symbols,(ptr->super_Class_declaration).name);
  *ppBVar3 = (mapped_type)this_00;
  this_01 = (BaseScope *)operator_new(0xa0);
  memset(this_01,0,0xa0);
  BaseScope::BaseScope(this_01);
  this->curr_scope = this_01;
  Class_declaration::SetScope(&ptr->super_Class_declaration,this_01);
  this->curr_scope->parent = pBVar1;
  std::vector<BaseScope_*,_std::allocator<BaseScope_*>_>::push_back
            (&pBVar1->children,&this->curr_scope);
  ppDVar2 = (ptr->super_Class_declaration).decls.
            super__Vector_base<Declaration_*,_std::allocator<Declaration_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar4 = (ptr->super_Class_declaration).decls.
                 super__Vector_base<Declaration_*,_std::allocator<Declaration_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppDVar4 != ppDVar2; ppDVar4 = ppDVar4 + 1) {
    (**((*ppDVar4)->super_Base)._vptr_Base)(*ppDVar4,this);
  }
  this->curr_scope = pBVar1;
  this->curr_class = (ClassSymbol *)0x0;
  return;
}

Assistant:

void symbol_table_visitor::visit(NotExtendedClassDeclaration* ptr) {
    assert_not_declared_in_this_scope(ptr->name);
    
    auto old = curr_scope;

    curr_class = new ClassSymbol(ptr);
    old->symbols[*ptr->name] = curr_class;
    curr_scope = new BaseScope();
    ptr->SetScope(curr_scope);
    curr_scope->parent = old;
    old->children.push_back(curr_scope);

    for(auto i : ptr->decls) {
        i->accept(this);
    }

    curr_scope = old;
    curr_class = nullptr;
    //name
}